

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  BYTE *source;
  BYTE *pBVar1;
  bool bVar2;
  int iVar3;
  uint maxNbBits;
  size_t err_code;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  symbolEncodingType_e sVar9;
  long lVar10;
  size_t err_code_2;
  ulong sourceSize;
  bool bVar11;
  HUF_repeat local_8c;
  ZSTD_symbolEncodingTypeStats_t local_68;
  size_t local_48;
  ZSTD_CCtx_params *local_40;
  seqStore_t *local_38;
  
  bVar11 = true;
  if (cctxParams->literalCompressionMode != ZSTD_lcm_huffman) {
    if (cctxParams->literalCompressionMode == ZSTD_lcm_uncompressed) {
      bVar11 = false;
    }
    else if ((cctxParams->cParams).strategy == ZSTD_fast) {
      bVar11 = (cctxParams->cParams).targetLength == 0;
    }
  }
  source = seqStorePtr->litStart;
  pBVar1 = seqStorePtr->lit;
  local_68.LLtype = 0xff;
  local_8c = (prevEntropy->huf).repeatMode;
  local_40 = cctxParams;
  local_38 = seqStorePtr;
  memcpy(nextEntropy,prevEntropy,0x404);
  if (!bVar11) {
    (entropyMetadata->hufMetadata).hType = set_basic;
    sVar5 = 0;
    goto LAB_0069ec68;
  }
  sourceSize = (long)pBVar1 - (long)source;
  uVar8 = 0x3f;
  if ((prevEntropy->huf).repeatMode == HUF_repeat_valid) {
    uVar8 = 6;
  }
  if (uVar8 < sourceSize) {
    sVar4 = HIST_count_wksp((uint *)workspace,&local_68.LLtype,source,sourceSize,workspace,wkspSize)
    ;
    bVar11 = false;
    if (sVar4 < 0xffffffffffffff89) {
      sVar9 = set_rle;
      if (sVar4 != sourceSize) {
        sVar9 = set_basic;
        bVar11 = true;
        bVar2 = (sourceSize >> 7) + 4 < sVar4;
        sVar4 = 0;
        if (bVar2) goto LAB_0069eae4;
      }
      (entropyMetadata->hufMetadata).hType = sVar9;
      bVar11 = false;
      sVar4 = 0;
    }
LAB_0069eae4:
    sVar5 = sVar4;
    if (!bVar11) goto LAB_0069ec68;
    if (local_8c == HUF_repeat_check) {
      iVar3 = HUF_validateCTable((HUF_CElt *)prevEntropy,(uint *)workspace,local_68.LLtype);
      local_8c = (HUF_repeat)(iVar3 != 0);
    }
    memset(nextEntropy,0,0x400);
    maxNbBits = HUF_optimalTableLog(0xb,sourceSize,local_68.LLtype);
    sVar5 = HUF_buildCTable_wksp
                      ((HUF_CElt *)nextEntropy,(uint *)workspace,local_68.LLtype,maxNbBits,
                       (void *)((long)workspace + 0x400),wkspSize - 0x400);
    if (0xffffffffffffff88 < sVar5) goto LAB_0069ec68;
    local_48 = sVar5;
    sVar6 = HUF_estimateCompressedSize((HUF_CElt *)nextEntropy,(uint *)workspace,local_68.LLtype);
    sVar7 = HUF_writeCTable_wksp
                      ((entropyMetadata->hufMetadata).hufDesBuffer,0x80,(HUF_CElt *)nextEntropy,
                       local_68.LLtype,(uint)local_48,(void *)((long)workspace + 0x400),
                       wkspSize - 0x400);
    if (local_8c != HUF_repeat_none) {
      sVar5 = HUF_estimateCompressedSize((HUF_CElt *)prevEntropy,(uint *)workspace,local_68.LLtype);
      bVar11 = true;
      if ((sVar5 < sourceSize) && (sourceSize <= sVar7 + 0xc || sVar5 <= sVar6 + sVar7)) {
        memcpy(nextEntropy,prevEntropy,0x404);
        (entropyMetadata->hufMetadata).hType = set_repeat;
        bVar11 = false;
        sVar4 = 0;
      }
      sVar5 = sVar4;
      if (!bVar11) goto LAB_0069ec68;
    }
    if (sVar6 + sVar7 < sourceSize) {
      (entropyMetadata->hufMetadata).hType = set_compressed;
      (nextEntropy->huf).repeatMode = HUF_repeat_check;
      sVar5 = sVar7;
      goto LAB_0069ec68;
    }
    memcpy(nextEntropy,prevEntropy,0x404);
  }
  (entropyMetadata->hufMetadata).hType = set_basic;
  sVar5 = 0;
LAB_0069ec68:
  (entropyMetadata->hufMetadata).hufDesSize = sVar5;
  if (sVar5 < 0xffffffffffffff89) {
    lVar10 = (long)local_38->sequences - (long)local_38->sequencesStart;
    if (lVar10 == 0) {
      (nextEntropy->fse).litlength_repeatMode = FSE_repeat_none;
      (nextEntropy->fse).offcode_repeatMode = FSE_repeat_none;
      (nextEntropy->fse).matchlength_repeatMode = FSE_repeat_none;
      local_68.lastCountSize = 0;
      local_68.size = 0;
      local_68.MLtype = set_basic;
      local_68.Offtype = set_basic;
      local_68.LLtype = set_basic;
    }
    else {
      ZSTD_buildSequencesStatistics
                (&local_68,local_38,lVar10 >> 3,&prevEntropy->fse,&nextEntropy->fse,
                 (entropyMetadata->fseMetadata).fseTablesBuffer,
                 &(entropyMetadata->fseMetadata).field_0x91,(local_40->cParams).strategy,
                 (uint *)workspace,(void *)((long)workspace + 0xd4),wkspSize - 0xd4);
    }
    if (local_68.size < 0xffffffffffffff89) {
      (entropyMetadata->fseMetadata).llType = local_68.LLtype;
      (entropyMetadata->fseMetadata).ofType = local_68.Offtype;
      (entropyMetadata->fseMetadata).mlType = local_68.MLtype;
      (entropyMetadata->fseMetadata).lastCountSize = local_68.lastCountSize;
    }
    (entropyMetadata->fseMetadata).fseTablesSize = local_68.size;
    sVar5 = 0;
    if (0xffffffffffffff88 < local_68.size) {
      sVar5 = local_68.size;
    }
  }
  return sVar5;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(seqStore_t* seqStorePtr,
                             const ZSTD_entropyCTables_t* prevEntropy,
                                   ZSTD_entropyCTables_t* nextEntropy,
                             const ZSTD_CCtx_params* cctxParams,
                                   ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                                   void* workspace, size_t wkspSize)
{
    size_t const litSize = seqStorePtr->lit - seqStorePtr->litStart;
    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_disableLiteralsCompression(cctxParams),
                                            workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}